

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int prune_ref_mv_idx_using_qindex(int reduce_inter_modes,int qindex,int ref_mv_idx)

{
  int min_prune_ref_mv_idx;
  int ref_mv_idx_local;
  int qindex_local;
  int reduce_inter_modes_local;
  undefined4 local_4;
  
  if (reduce_inter_modes < 3) {
    local_4 = (uint)((qindex * 3) / 0x100 + 1 <= ref_mv_idx);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int prune_ref_mv_idx_using_qindex(const int reduce_inter_modes,
                                         const int qindex,
                                         const int ref_mv_idx) {
  if (reduce_inter_modes >= 3) return 1;
  // Q-index logic based pruning is enabled only for
  // reduce_inter_modes = 2.
  assert(reduce_inter_modes == 2);
  // When reduce_inter_modes=2, pruning happens as below based on q index.
  // For q index range between 0 and 85: prune if ref_mv_idx >= 1.
  // For q index range between 86 and 170: prune if ref_mv_idx == 2.
  // For q index range between 171 and 255: no pruning.
  const int min_prune_ref_mv_idx = (qindex * 3 / QINDEX_RANGE) + 1;
  return (ref_mv_idx >= min_prune_ref_mv_idx);
}